

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnSetFloat(XL *out,char *key,float value)

{
  XL pvVar1;
  int iVar2;
  
  pvVar1 = *out;
  if (((*key == 'l') && (key[1] == 'r')) && (key[2] == '\0')) {
    *(float *)((long)pvVar1 + 0x94) = value;
  }
  else {
    iVar2 = strcmp(key,"lambda");
    if (iVar2 == 0) {
      *(float *)((long)pvVar1 + 0x98) = value;
    }
    else {
      iVar2 = strcmp(key,"init");
      if (iVar2 == 0) {
        *(float *)((long)pvVar1 + 0x9c) = value;
      }
      else {
        iVar2 = strcmp(key,"alpha");
        if (iVar2 == 0) {
          *(float *)((long)pvVar1 + 0xa0) = value;
        }
        else {
          iVar2 = strcmp(key,"beta");
          if (iVar2 == 0) {
            *(float *)((long)pvVar1 + 0xa4) = value;
          }
          else {
            iVar2 = strcmp(key,"lambda_1");
            if (iVar2 == 0) {
              *(float *)((long)pvVar1 + 0xa8) = value;
            }
            else {
              iVar2 = strcmp(key,"lambda_2");
              if (iVar2 == 0) {
                *(float *)((long)pvVar1 + 0xac) = value;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetFloat(XL *out, const char *key, const float value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "lr") == 0) {
    xl->GetHyperParam().learning_rate = value;
  } else if (strcmp(key, "lambda") == 0) {
    xl->GetHyperParam().regu_lambda = value;
  } else if (strcmp(key, "init") == 0) {
    xl->GetHyperParam().model_scale = value;
  } else if (strcmp(key, "alpha") == 0) {
    xl->GetHyperParam().alpha = value;
  } else if (strcmp(key, "beta") == 0) {
    xl->GetHyperParam().beta = value;
  } else if (strcmp(key, "lambda_1") == 0) {
    xl->GetHyperParam().lambda_1 = value;
  } else if (strcmp(key, "lambda_2") == 0) {
    xl->GetHyperParam().lambda_2 = value;
  }
  API_END();
}